

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportFileGenerator.cxx
# Opt level: O1

void __thiscall
cmExportFileGenerator::GenerateImportedFileChecksCode
          (cmExportFileGenerator *this,ostream *os,cmGeneratorTarget *target,
          ImportPropertyMap *properties,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *importedLocations)

{
  pointer pcVar1;
  char *pcVar2;
  ostream *poVar3;
  const_iterator cVar4;
  _Base_ptr p_Var5;
  _Rb_tree_header *p_Var6;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string targetName;
  string local_90;
  string local_70;
  string local_50;
  
  pcVar1 = (this->Namespace)._M_dataplus._M_p;
  pcVar2 = (char *)(this->Namespace)._M_string_length;
  cmGeneratorTarget::GetExportName_abi_cxx11_(&local_50,target);
  local_90.field_2._M_allocated_capacity = local_50._M_string_length;
  local_90.field_2._8_8_ = local_50._M_dataplus._M_p;
  views._M_len = 2;
  views._M_array = (iterator)&local_90;
  local_90._M_dataplus._M_p = pcVar2;
  local_90._M_string_length = (size_type)pcVar1;
  cmCatViews_abi_cxx11_(&local_70,views);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (os,"list(APPEND _cmake_import_check_targets ",0x28);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (os,local_70._M_dataplus._M_p,local_70._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3," )\nlist(APPEND _cmake_import_check_files_for_",0x2d);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,local_70._M_dataplus._M_p,local_70._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
  p_Var5 = (importedLocations->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var6 = &(importedLocations->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var5 != p_Var6) {
    do {
      cVar4 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::find(&properties->_M_t,(key_type *)(p_Var5 + 1));
      if ((_Rb_tree_header *)cVar4._M_node != &(properties->_M_t)._M_impl.super__Rb_tree_header) {
        cmExportFileGeneratorEscape(&local_90,(string *)(cVar4._M_node + 2));
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           (os,local_90._M_dataplus._M_p,local_90._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
        }
      }
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
    } while ((_Rb_tree_header *)p_Var5 != p_Var6);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,")\n\n",3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmExportFileGenerator::GenerateImportedFileChecksCode(
  std::ostream& os, cmGeneratorTarget* target,
  ImportPropertyMap const& properties,
  const std::set<std::string>& importedLocations)
{
  // Construct the imported target name.
  std::string targetName = cmStrCat(this->Namespace, target->GetExportName());

  os << "list(APPEND _cmake_import_check_targets " << targetName
     << " )\n"
        "list(APPEND _cmake_import_check_files_for_"
     << targetName << " ";

  for (std::string const& li : importedLocations) {
    auto pi = properties.find(li);
    if (pi != properties.end()) {
      os << cmExportFileGeneratorEscape(pi->second) << " ";
    }
  }

  os << ")\n\n";
}